

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3VdbeExpandSql(Vdbe *p,char *zRawSql)

{
  uchar *puVar1;
  ushort uVar2;
  sqlite3 *psVar3;
  u8 uVar4;
  Vdbe *pVVar5;
  char cVar6;
  int nName;
  int iVar7;
  ulong uVar8;
  size_t sVar9;
  char *pcVar10;
  long lVar11;
  int nTotal;
  uint N;
  int iVar12;
  long lVar13;
  uchar *puVar14;
  Mem *pMVar15;
  long in_FS_OFFSET;
  int idx;
  StrAccum out;
  int tokenType;
  Mem utf8;
  char zBase [100];
  int local_134;
  StrAccum local_130;
  int local_108;
  int local_104;
  Vdbe *local_100;
  MemValue local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  sqlite3 *psStack_d0;
  undefined8 local_c8;
  Mem *local_b8;
  sqlite3 *local_b0;
  char local_a8 [112];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_134 = 0;
  psVar3 = p->db;
  local_130.mxAlloc = psVar3->aLimit[0];
  local_130.zBase = local_a8;
  local_130.db = (sqlite3 *)0x0;
  local_130.nChar = 0;
  local_130.nAlloc = 100;
  local_130.accError = '\0';
  local_130.printfFlags = '\0';
  local_130.zText = local_130.zBase;
  if (psVar3->nVdbeExec < 2) {
    if (p->nVar == 0) {
      if (zRawSql == (char *)0x0) {
        N = 0;
      }
      else {
        sVar9 = strlen(zRawSql);
        N = (uint)sVar9 & 0x3fffffff;
      }
LAB_0011bc91:
      sqlite3StrAccumAppend(&local_130,zRawSql,N);
    }
    else {
      local_100 = p;
      local_b0 = psVar3;
      if (*zRawSql != '\0') {
        iVar12 = 1;
        do {
          N = 0;
          puVar14 = (uchar *)zRawSql;
          while (nName = sqlite3GetToken(puVar14,&local_108), local_108 != 0x87) {
            N = N + nName;
            puVar1 = puVar14 + nName;
            puVar14 = puVar14 + nName;
            if (*puVar1 == '\0') goto LAB_0011bc91;
          }
          sqlite3StrAccumAppend(&local_130,zRawSql,N);
          pVVar5 = local_100;
          if (nName == 0) break;
          puVar14 = (uchar *)zRawSql + (int)N;
          if (*puVar14 == '?') {
            if (1 < nName) {
              sqlite3GetInt32((char *)(puVar14 + 1),&local_134);
              iVar12 = local_134;
            }
          }
          else {
            iVar12 = sqlite3VListNameToNum(local_100->pVList,(char *)puVar14,nName);
          }
          local_134 = iVar12;
          iVar12 = local_134;
          uVar2 = pVVar5->aVar[(long)local_134 + -1].flags;
          if ((uVar2 & 1) == 0) {
            pMVar15 = pVVar5->aVar + local_134;
            if ((uVar2 & 4) == 0) {
              if ((uVar2 & 8) == 0) {
                if ((uVar2 & 2) == 0) {
                  if ((uVar2 >> 0xe & 1) == 0) {
                    uVar8 = local_130._24_8_ & 0xffffffff;
                    local_104 = local_134;
                    if (local_130.nChar + 2 < local_130.nAlloc) {
                      local_130.nChar = local_130.nChar + 2;
                      (local_130.zText + uVar8)[0] = 'x';
                      (local_130.zText + uVar8)[1] = '\'';
                    }
                    else {
                      enlargeAndAppend(&local_130,"x\'",2);
                    }
                    iVar12 = pMVar15[-1].n;
                    if (0 < (long)iVar12) {
                      lVar13 = 0;
                      local_b8 = pMVar15;
                      do {
                        sqlite3XPrintf(&local_130,"%02x",(ulong)(byte)local_b8[-1].z[lVar13]);
                        lVar13 = lVar13 + 1;
                      } while (iVar12 != lVar13);
                    }
                    uVar8 = local_130._24_8_ & 0xffffffff;
                    if (local_130.nChar + 1 < local_130.nAlloc) {
                      local_130.nChar = local_130.nChar + 1;
                      local_130.zText[uVar8] = '\'';
                      iVar12 = local_104;
                    }
                    else {
                      enlargeAndAppend(&local_130,"\'",1);
                      iVar12 = local_104;
                    }
                  }
                  else {
                    sqlite3XPrintf(&local_130,"zeroblob(%d)",(ulong)(uint)pMVar15[-1].u.nZero);
                  }
                }
                else if (local_b0->enc == '\x01') {
                  sqlite3XPrintf(&local_130,"\'%.*q\'",(ulong)(uint)pMVar15[-1].n,pMVar15[-1].z);
                }
                else {
                  local_d8 = 0;
                  local_e8 = 0;
                  uStack_e0 = 0;
                  local_f8.r = 0.0;
                  uStack_f0 = 0;
                  local_c8 = 0;
                  psStack_d0 = local_b0;
                  sqlite3VdbeMemSetStr
                            ((Mem *)&local_f8,pMVar15[-1].z,pMVar15[-1].n,local_b0->enc,
                             (_func_void_void_ptr *)0x0);
                  if ((((uStack_f0 & 2) != 0) && (uStack_f0._2_1_ != '\x01')) &&
                     (iVar7 = sqlite3VdbeMemTranslate((Mem *)&local_f8,'\x01'), iVar7 == 7)) {
                    local_130.accError = 1;
                    local_130._24_8_ = local_130._24_8_ & 0xffffffff;
                  }
                  sqlite3XPrintf(&local_130,"\'%.*q\'",uStack_f0 >> 0x20,local_e8);
                  if (((uStack_f0 & 0x2460) != 0) || ((int)local_d8 != 0)) {
                    vdbeMemClear((Mem *)&local_f8);
                  }
                }
              }
              else {
                sqlite3XPrintf(&local_130,"%!.15g",pMVar15[-1].u.nZero);
              }
            }
            else {
              sqlite3XPrintf(&local_130,"%lld",pMVar15[-1].u.r);
            }
          }
          else {
            uVar8 = local_130._24_8_ & 0xffffffff;
            if (local_130.nChar + 4 < local_130.nAlloc) {
              local_130.nChar = local_130.nChar + 4;
              builtin_strncpy(local_130.zText + uVar8,"NULL",4);
            }
            else {
              enlargeAndAppend(&local_130,"NULL",4);
            }
          }
          zRawSql = (char *)(puVar14 + nName);
          iVar12 = iVar12 + 1;
        } while (*zRawSql != '\0');
      }
    }
  }
  else {
    cVar6 = *zRawSql;
    if (cVar6 != '\0') {
      do {
        lVar13 = 1;
        do {
          lVar11 = lVar13;
          if (cVar6 == '\n') break;
          cVar6 = zRawSql[lVar11];
          lVar13 = lVar11 + 1;
        } while (cVar6 != '\0');
        uVar8 = local_130._24_8_ & 0xffffffff;
        if (local_130.nChar + 3 < local_130.nAlloc) {
          local_130.nChar = local_130.nChar + 3;
          local_130.zText[uVar8 + 2] = ' ';
          (local_130.zText + uVar8)[0] = '-';
          (local_130.zText + uVar8)[1] = '-';
        }
        else {
          enlargeAndAppend(&local_130,"-- ",3);
        }
        sqlite3StrAccumAppend(&local_130,zRawSql,(int)lVar11);
        cVar6 = zRawSql[lVar11];
        zRawSql = zRawSql + lVar11;
      } while (cVar6 != '\0');
    }
  }
  if (local_130.accError != '\0') {
    uVar4 = local_130.printfFlags;
    if ((local_130._36_2_ & 0x400) != 0) {
      if (local_130.zText != (char *)0x0) {
        sqlite3DbFreeNN(local_130.db,local_130.zText);
      }
      local_130._36_2_ = CONCAT11(uVar4,local_130.accError) & 0xfbff;
    }
    local_130.zText = (char *)0x0;
  }
  pcVar10 = sqlite3StrAccumFinish(&local_130);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pcVar10;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VdbeExpandSql(
  Vdbe *p,                 /* The prepared statement being evaluated */
  const char *zRawSql      /* Raw text of the SQL statement */
){
  sqlite3 *db;             /* The database connection */
  int idx = 0;             /* Index of a host parameter */
  int nextIndex = 1;       /* Index of next ? host parameter */
  int n;                   /* Length of a token prefix */
  int nToken;              /* Length of the parameter token */
  int i;                   /* Loop counter */
  Mem *pVar;               /* Value of a host parameter */
  StrAccum out;            /* Accumulate the output here */
#ifndef SQLITE_OMIT_UTF16
  Mem utf8;                /* Used to convert UTF16 parameters into UTF8 for display */
#endif
  char zBase[100];         /* Initial working space */

  db = p->db;
  sqlite3StrAccumInit(&out, 0, zBase, sizeof(zBase), 
                      db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( db->nVdbeExec>1 ){
    while( *zRawSql ){
      const char *zStart = zRawSql;
      while( *(zRawSql++)!='\n' && *zRawSql );
      sqlite3StrAccumAppend(&out, "-- ", 3);
      assert( (zRawSql - zStart) > 0 );
      sqlite3StrAccumAppend(&out, zStart, (int)(zRawSql-zStart));
    }
  }else if( p->nVar==0 ){
    sqlite3StrAccumAppend(&out, zRawSql, sqlite3Strlen30(zRawSql));
  }else{
    while( zRawSql[0] ){
      n = findNextHostParameter(zRawSql, &nToken);
      assert( n>0 );
      sqlite3StrAccumAppend(&out, zRawSql, n);
      zRawSql += n;
      assert( zRawSql[0] || nToken==0 );
      if( nToken==0 ) break;
      if( zRawSql[0]=='?' ){
        if( nToken>1 ){
          assert( sqlite3Isdigit(zRawSql[1]) );
          sqlite3GetInt32(&zRawSql[1], &idx);
        }else{
          idx = nextIndex;
        }
      }else{
        assert( zRawSql[0]==':' || zRawSql[0]=='$' ||
                zRawSql[0]=='@' || zRawSql[0]=='#' );
        testcase( zRawSql[0]==':' );
        testcase( zRawSql[0]=='$' );
        testcase( zRawSql[0]=='@' );
        testcase( zRawSql[0]=='#' );
        idx = sqlite3VdbeParameterIndex(p, zRawSql, nToken);
        assert( idx>0 );
      }
      zRawSql += nToken;
      nextIndex = idx + 1;
      assert( idx>0 && idx<=p->nVar );
      pVar = &p->aVar[idx-1];
      if( pVar->flags & MEM_Null ){
        sqlite3StrAccumAppend(&out, "NULL", 4);
      }else if( pVar->flags & MEM_Int ){
        sqlite3XPrintf(&out, "%lld", pVar->u.i);
      }else if( pVar->flags & MEM_Real ){
        sqlite3XPrintf(&out, "%!.15g", pVar->u.r);
      }else if( pVar->flags & MEM_Str ){
        int nOut;  /* Number of bytes of the string text to include in output */
#ifndef SQLITE_OMIT_UTF16
        u8 enc = ENC(db);
        if( enc!=SQLITE_UTF8 ){
          memset(&utf8, 0, sizeof(utf8));
          utf8.db = db;
          sqlite3VdbeMemSetStr(&utf8, pVar->z, pVar->n, enc, SQLITE_STATIC);
          if( SQLITE_NOMEM==sqlite3VdbeChangeEncoding(&utf8, SQLITE_UTF8) ){
            out.accError = STRACCUM_NOMEM;
            out.nAlloc = 0;
          }
          pVar = &utf8;
        }
#endif
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ){
          nOut = SQLITE_TRACE_SIZE_LIMIT;
          while( nOut<pVar->n && (pVar->z[nOut]&0xc0)==0x80 ){ nOut++; }
        }
#endif    
        sqlite3XPrintf(&out, "'%.*q'", nOut, pVar->z);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3XPrintf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
#ifndef SQLITE_OMIT_UTF16
        if( enc!=SQLITE_UTF8 ) sqlite3VdbeMemRelease(&utf8);
#endif
      }else if( pVar->flags & MEM_Zero ){
        sqlite3XPrintf(&out, "zeroblob(%d)", pVar->u.nZero);
      }else{
        int nOut;  /* Number of bytes of the blob to include in output */
        assert( pVar->flags & MEM_Blob );
        sqlite3StrAccumAppend(&out, "x'", 2);
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ) nOut = SQLITE_TRACE_SIZE_LIMIT;
#endif
        for(i=0; i<nOut; i++){
          sqlite3XPrintf(&out, "%02x", pVar->z[i]&0xff);
        }
        sqlite3StrAccumAppend(&out, "'", 1);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3XPrintf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
      }
    }
  }
  if( out.accError ) sqlite3StrAccumReset(&out);
  return sqlite3StrAccumFinish(&out);
}